

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

int onig_st_lookup(st_table *table,st_data_t key,st_data_t *value)

{
  st_table_entry *psVar1;
  uint uVar2;
  int iVar3;
  st_table_entry *psVar4;
  
  uVar2 = (*table->type->hash)(key);
  psVar4 = table->bins[(ulong)uVar2 % (ulong)(uint)table->num_bins];
  iVar3 = 0;
  if (psVar4 != (st_table_entry *)0x0) {
    if ((psVar4->hash == uVar2) &&
       ((psVar4->key == key || (iVar3 = (*table->type->compare)(key,psVar4->key), iVar3 == 0)))) {
LAB_0012b9db:
      iVar3 = 1;
      if (value != (st_data_t *)0x0) {
        *value = psVar4->record;
      }
    }
    else {
      psVar1 = psVar4;
      for (psVar4 = psVar4->next; iVar3 = 0, psVar4 != (st_table_entry *)0x0; psVar4 = psVar4->next)
      {
        if (psVar4->hash == uVar2) {
          if (psVar4->key == key) goto LAB_0012b9db;
          iVar3 = (*table->type->compare)(key,psVar4->key);
          psVar4 = psVar1->next;
          if (iVar3 == 0) {
            if (psVar4 == (st_table_entry *)0x0) {
              return 0;
            }
            goto LAB_0012b9db;
          }
        }
        psVar1 = psVar4;
      }
    }
  }
  return iVar3;
}

Assistant:

extern int
st_lookup(st_table* table, register st_data_t key, st_data_t* value)
{
  unsigned int hash_val, bin_pos;
  register st_table_entry *ptr;

  hash_val = do_hash(key, table);
  FIND_ENTRY(table, ptr, hash_val, bin_pos);

  if (ptr == 0) {
    return 0;
  }
  else {
    if (value != 0)  *value = ptr->record;
    return 1;
  }
}